

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O2

uint Curl_rand(SessionHandle *data)

{
  int __fd;
  ssize_t sVar1;
  timeval tVar2;
  
  if (Curl_rand_seeded == '\0') {
    __fd = open64("/dev/urandom",0);
    if (-1 < __fd) {
      sVar1 = read(__fd,&Curl_rand::randseed,4);
      if (sVar1 == 4) {
        Curl_rand_seeded = '\x01';
      }
      close(__fd);
    }
    if (Curl_rand_seeded == '\0') {
      tVar2 = curlx_tvnow();
      Curl_infof(data,"WARNING: Using weak random seed\n");
      Curl_rand::randseed =
           ((int)tVar2.tv_sec + (int)tVar2.tv_usec + Curl_rand::randseed) * -0x7f82434b + 0xa70427df
      ;
      Curl_rand_seeded = '\x01';
    }
  }
  Curl_rand::randseed = Curl_rand::randseed * 0x41c64e6d + 0x3039;
  return Curl_rand::randseed * 0x10000 | Curl_rand::randseed >> 0x10;
}

Assistant:

unsigned int Curl_rand(struct SessionHandle *data)
{
  unsigned int r = 0;
  static unsigned int randseed;
  static bool seeded = FALSE;

#ifdef CURLDEBUG
  char *force_entropy = getenv("CURL_ENTROPY");
  if(force_entropy) {
    if(!seeded) {
      size_t elen = strlen(force_entropy);
      size_t clen = sizeof(randseed);
      size_t min = elen < clen ? elen : clen;
      memcpy((char *)&randseed, force_entropy, min);
      seeded = TRUE;
    }
    else
      randseed++;
    return randseed;
  }
#endif

  /* data may be NULL! */
  if(!Curl_ssl_random(data, (unsigned char *)&r, sizeof(r)))
    return r;

  /* If Curl_ssl_random() returns non-zero it couldn't offer randomness and we
     instead perform a "best effort" */

#ifdef RANDOM_FILE
  if(!seeded) {
    /* if there's a random file to read a seed from, use it */
    int fd = open(RANDOM_FILE, O_RDONLY);
    if(fd > -1) {
      /* read random data into the randseed variable */
      ssize_t nread = read(fd, &randseed, sizeof(randseed));
      if(nread == sizeof(randseed))
        seeded = TRUE;
      close(fd);
    }
  }
#endif

  if(!seeded) {
    struct timeval now = curlx_tvnow();
    infof(data, "WARNING: Using weak random seed\n");
    randseed += (unsigned int)now.tv_usec + (unsigned int)now.tv_sec;
    randseed = randseed * 1103515245 + 12345;
    randseed = randseed * 1103515245 + 12345;
    randseed = randseed * 1103515245 + 12345;
    seeded = TRUE;
  }

  /* Return an unsigned 32-bit pseudo-random number. */
  r = randseed = randseed * 1103515245 + 12345;
  return (r << 16) | ((r >> 16) & 0xFFFF);
}